

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transaction_common.hpp
# Opt level: O2

void __thiscall
afsm::test::transit_action::operator()
          (transit_action *this,command_complete *param_1,
          inner_state_machine<afsm::test::connection_pri_fsm_def::transaction::extended_query,_afsm::inner_state_machine<afsm::test::connection_pri_fsm_def::transaction,_afsm::priority_state_machine<afsm::test::connection_pri_fsm_def,_std::mutex,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>_>_>
          *param_2,state<afsm::test::connection_pri_fsm_def::transaction::extended_query::exec,_afsm::inner_state_machine<afsm::test::connection_pri_fsm_def::transaction::extended_query,_afsm::inner_state_machine<afsm::test::connection_pri_fsm_def::transaction,_afsm::priority_state_machine<afsm::test::connection_pri_fsm_def,_std::mutex,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>_>_>_>
                   *src,
          state<afsm::test::connection_pri_fsm_def::transaction::extended_query::exec,_afsm::inner_state_machine<afsm::test::connection_pri_fsm_def::transaction::extended_query,_afsm::inner_state_machine<afsm::test::connection_pri_fsm_def::transaction,_afsm::priority_state_machine<afsm::test::connection_pri_fsm_def,_std::mutex,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>_>_>_>
          *tgt)

{
  long lVar1;
  ostream *poVar2;
  string local_60 [32];
  string local_40 [32];
  
  poVar2 = psst::operator<<((ostream *)&std::cerr,cyan|bright);
  lVar1 = *(long *)poVar2;
  *(undefined8 *)(poVar2 + *(long *)(lVar1 + -0x18) + 0x10) = 0x11;
  lVar1 = *(long *)(lVar1 + -0x18);
  *(uint *)(poVar2 + lVar1 + 0x18) = *(uint *)(poVar2 + lVar1 + 0x18) & 0xffffff4f | 0x20;
  poVar2 = std::operator<<(poVar2,(string *)events::command_complete::name_abi_cxx11_);
  poVar2 = psst::operator<<(poVar2,clear);
  poVar2 = std::operator<<(poVar2,": ");
  (*(src->super_state_base<afsm::test::connection_pri_fsm_def::transaction::extended_query::exec>).
    super_type.super_exec.super_state<exec>.super_common_base<afsm::test::state_name>.
    super_state_name._vptr_state_name[2])(local_40,src);
  poVar2 = std::operator<<(poVar2,local_40);
  poVar2 = std::operator<<(poVar2," -> ");
  (*(tgt->super_state_base<afsm::test::connection_pri_fsm_def::transaction::extended_query::exec>).
    super_type.super_exec.super_state<exec>.super_common_base<afsm::test::state_name>.
    super_state_name._vptr_state_name[2])(local_60,tgt);
  poVar2 = std::operator<<(poVar2,local_60);
  std::operator<<(poVar2,"\n");
  std::__cxx11::string::~string(local_60);
  std::__cxx11::string::~string(local_40);
  return;
}

Assistant:

void
    operator()(Event&&, FSM&, SourceState& src, TargetState& tgt) const
    {
        using ::psst::ansi_color;
        ::std::cerr
                << (ansi_color::cyan | ansi_color::bright)
                << ::std::setw(event_name_width) << ::std::left
                << Event::name << ansi_color::clear
                << ": " << src.name() << " -> " << tgt.name() << "\n";
    }